

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O0

void __thiscall
Js::FunctionProxy::MapFunctionObjectTypes<Js::FunctionBody::UpdateEntryPointsOnDebugReparse()::__0>
          (FunctionProxy *this,anon_class_24_3_558ab67d func)

{
  FunctionTypeWeakRefList *this_00;
  ScriptFunctionType **ppSVar1;
  FunctionTypeWeakRefList *functionObjectTypeList;
  FunctionProxy *this_local;
  
  this_00 = GetFunctionObjectTypeList(this);
  if (this_00 != (FunctionTypeWeakRefList *)0x0) {
    JsUtil::
    List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>
    ::
    Map<Js::FunctionProxy::MapFunctionObjectTypes<Js::FunctionBody::UpdateEntryPointsOnDebugReparse()::__0>(Js::FunctionBody::UpdateEntryPointsOnDebugReparse()::__0)::_lambda(int,Memory::RecyclerWeakReference<Js::ScriptFunctionType>*)_1_>
              ((List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>
                *)this_00,&func);
  }
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunctionType__
                      ((WriteBarrierPtr *)&this->deferredPrototypeType);
  if (*ppSVar1 != (ScriptFunctionType *)0x0) {
    ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunctionType__
                        ((WriteBarrierPtr *)&this->deferredPrototypeType);
    FunctionBody::UpdateEntryPointsOnDebugReparse::anon_class_24_3_558ab67d::operator()
              (&func,*ppSVar1);
  }
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunctionType__
                      ((WriteBarrierPtr *)&this->undeferredFunctionType);
  if (*ppSVar1 != (ScriptFunctionType *)0x0) {
    ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunctionType__
                        ((WriteBarrierPtr *)&this->undeferredFunctionType);
    FunctionBody::UpdateEntryPointsOnDebugReparse::anon_class_24_3_558ab67d::operator()
              (&func,*ppSVar1);
  }
  return;
}

Assistant:

void MapFunctionObjectTypes(Fn func)
        {
            FunctionTypeWeakRefList* functionObjectTypeList = this->GetFunctionObjectTypeList();
            if (functionObjectTypeList != nullptr)
            {
                functionObjectTypeList->Map([&](int, FunctionTypeWeakRef* typeWeakRef)
                {
                    if (typeWeakRef)
                    {
                        ScriptFunctionType* type = typeWeakRef->Get();
                        if (type)
                        {
                            func(type);
                        }
                    }
                });
            }

            if (this->deferredPrototypeType)
            {
                func(this->deferredPrototypeType);
            }
            if (this->undeferredFunctionType)
            {
                func(this->undeferredFunctionType);
            }
        }